

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

int program_init(bov_window_t *window,int program_index,int n,...)

{
  GLuint object;
  char in_AL;
  int iVar1;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  object = window->program[(uint)program_index];
  local_f0 = &vl[0].overflow_arg_area;
  uVar3 = 0x18;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (0 < n) {
    do {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar2 = (void **)((long)local_d8 + uVar4);
      }
      else {
        ppvVar2 = local_f0;
        local_f0 = local_f0 + 1;
      }
      (*glad_glAttachShader)(object,*(GLuint *)ppvVar2);
      n = n + -1;
    } while (n != 0);
  }
  (*glad_glBindFragDataLocation)(object,0,"outColor");
  (*glad_glLinkProgram)(object);
  iVar1 = checkivError(object,0x8b82,glad_glGetProgramiv,glad_glGetProgramInfoLog);
  if (iVar1 != 0) {
    program_init_cold_1();
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int program_init(bov_window_t* window, int program_index, int n, ...)
{
	GLuint shaderProgram =  window->program[program_index];
	int i;
	va_list vl;

	va_start(vl,n);
	for (i=0; i<n; i++)
	{
		glAttachShader(shaderProgram, va_arg(vl,GLuint));
	}
	va_end(vl);

	glBindFragDataLocation(shaderProgram, 0, "outColor");
	glLinkProgram(shaderProgram);

	if(checkivError(shaderProgram,
	                GL_LINK_STATUS,
	                glGetProgramiv,
	                glGetProgramInfoLog)) {
		BOV_ERROR_LOG(BOV_SHADER_ERROR,
		              "shader program %d creation failed",
		              program_index);
		return 1;
	}

	return 0;
}